

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall
pstore::storage::map_bytes(storage *this,uint64_t old_logical_size,uint64_t new_logical_size)

{
  bool bVar1;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *this_01;
  pointer pfVar2;
  ulong local_48;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  local_38;
  size_type local_30;
  size_type old_num_regions;
  uint64_t old_physical_size;
  uint64_t new_logical_size_local;
  uint64_t old_logical_size_local;
  storage *this_local;
  
  old_physical_size = new_logical_size;
  new_logical_size_local = old_logical_size;
  old_logical_size_local = (uint64_t)this;
  bVar1 = std::
          vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
          ::empty(&this->regions_);
  if (bVar1) {
    local_48 = 0;
  }
  else {
    this_00 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                 ::back(&this->regions_);
    this_01 = std::
              __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    local_48 = memory_mapper_base::end(this_01);
  }
  old_num_regions = local_48;
  if (local_48 < old_physical_size) {
    local_30 = std::
               vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
               ::size(&this->regions_);
    pfVar2 = std::unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
             ::operator->(&this->region_factory_);
    gsl::
    not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
    ::not_null(&local_38,&this->regions_);
    (*pfVar2->_vptr_factory[3])(pfVar2,local_38.ptr_,old_num_regions,old_physical_size);
    update_master_pointers(this,local_30);
  }
  else if (old_physical_size < new_logical_size_local) {
    shrink(this,old_physical_size);
  }
  return;
}

Assistant:

void storage::map_bytes (std::uint64_t const old_logical_size,
                             std::uint64_t const new_logical_size) {
        // Get the file offset of the end of the last memory mapped region.
        std::uint64_t const old_physical_size =
            regions_.empty () ? std::uint64_t{0} : regions_.back ()->end ();
        if (new_logical_size > old_physical_size) {
            // if growing the storage
            auto const old_num_regions = regions_.size ();
            // Allocate new memory region(s) to accommodate the additional bytes requested.
            region_factory_->add (&regions_, old_physical_size, new_logical_size);
            this->update_master_pointers (old_num_regions);
            return;
        }
        if (new_logical_size < old_logical_size) {
            // if shrinking the storage
            this->shrink (new_logical_size);
        }
    }